

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O2

int base58_decode(char *base58,size_t base58_len,uchar *bytes_out,size_t *len)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t *dest;
  uint *puVar4;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  size_t __n;
  bool bVar13;
  uint32_t bn_buf [128];
  
  if (base58_len == 0 || base58 == (char *)0x0) {
    return -2;
  }
  uVar3 = base58_len * 6 + 7;
  lVar12 = 1;
  __n = 0;
  do {
    if (base58_len == __n) {
LAB_003efb9c:
      if ((bytes_out != (uchar *)0x0) && (base58_len <= *len)) {
        memset(bytes_out,0,base58_len);
      }
      *len = base58_len;
      return 0;
    }
    if (base58[__n] != '1') {
      if (base58_len != __n) {
        uVar10 = (uVar3 >> 3) + 3;
        if (uVar3 < 0x1008) {
          dest = bn_buf;
        }
        else {
          dest = (uint32_t *)wally_malloc(uVar10 & 0x3ffffffffffffffc);
          if (dest == (uint32_t *)0x0) {
            return -3;
          }
        }
        puVar6 = dest + ((uVar10 >> 2) - 1);
        *puVar6 = 0;
        lVar8 = 0;
        iVar11 = -2;
        puVar4 = puVar6;
        break;
      }
      goto LAB_003efb9c;
    }
    __n = __n + 1;
    lVar12 = lVar12 + 1;
    uVar3 = uVar3 - 6;
  } while( true );
LAB_003efc3d:
  puVar7 = puVar4;
  if (base58_len - __n == lVar8) {
    for (; puVar7 < dest + (uVar10 >> 2); puVar7 = puVar7 + 1) {
      uVar2 = *puVar7;
      *puVar7 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
    lVar8 = 0;
    do {
      lVar5 = lVar8;
      lVar8 = lVar5 + 1;
    } while (*(char *)((long)puVar4 + lVar5) == '\0');
    uVar3 = (long)dest + (((uVar10 & 0xfffffffffffffffc) + (lVar12 - (long)puVar4)) - lVar8);
    if ((bytes_out != (uchar *)0x0) && (uVar3 <= *len)) {
      memset(bytes_out,0,__n);
      memcpy(bytes_out + __n,(void *)((long)puVar4 + lVar5),
             (long)dest + (((uVar10 & 0xfffffffffffffffc) - (long)puVar4) - lVar8) + 1);
    }
    *len = uVar3;
    iVar11 = 0;
LAB_003efd21:
    wally_clear(dest,uVar10 & 0x3ffffffffffffffc);
    if (dest != bn_buf) {
      wally_free(dest);
    }
    return iVar11;
  }
  if (""[(byte)base58[__n + lVar8]] == '\0') goto LAB_003efd21;
  uVar3 = (ulong)(byte)(""[(byte)base58[__n + lVar8]] - 1);
  puVar7 = puVar6;
  do {
    if (puVar7 < puVar4) goto LAB_003efc94;
    uVar9 = uVar3 + (ulong)*puVar7 * 0x3a;
    *puVar7 = (uint)uVar9;
    uVar3 = uVar9 >> 0x20;
    puVar1 = puVar7 + -1;
    bVar13 = puVar7 != puVar4;
    puVar7 = puVar1;
  } while ((bVar13) || (uVar3 == 0));
  puVar4[-1] = (uint)(uVar9 >> 0x20);
  puVar4 = puVar4 + -1;
LAB_003efc94:
  lVar8 = lVar8 + 1;
  goto LAB_003efc3d;
}

Assistant:

static int base58_decode(const char *base58, size_t base58_len,
                         unsigned char *bytes_out, size_t *len)
{
    uint32_t bn_buf[BIGNUM_WORDS];
    uint32_t *bn = bn_buf, *top_word, *bn_p;
    size_t bn_words = 0, ones, cp_len, i;
    unsigned char *cp;
    int ret = WALLY_EINVAL;

    if (!base58 || !base58_len)
        return WALLY_EINVAL; /* Empty string can't be decoded or represented */

    /* Process leading '1's */
    for (ones = 0; ones < base58_len && base58[ones] == '1'; ++ones)
        ; /* no-op*/

    if (!(base58_len -= ones)) {
        if (bytes_out && ones <= *len)
            memset(bytes_out, 0, ones);
        *len = ones;
        return WALLY_OK; /* String of all '1's */
    }
    base58 += ones; /* Skip over leading '1's */

    /* Take 6 bits to store each 58 bit number, rounded up to the next byte,
     * then round that up to a uint32_t word boundary. */
    bn_words = ((base58_len * 6 + 7) / 8 + 3) / 4;

    /* Allocate our bignum buffer if it won't fit on the stack */
    if (bn_words > BIGNUM_WORDS)
        if (!(bn = wally_malloc(bn_words * sizeof(*bn)))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

    /* Iterate through the characters adding them to our bignum. We keep
     * track of the current top word to avoid iterating over words that
     * we know are zero. */
    top_word = bn + bn_words - 1;
    *top_word = 0;

    for (i = 0; i < base58_len; ++i) {
        unsigned char byte = base58_to_byte[((unsigned char *)base58)[i]];
        if (!byte--)
            goto cleanup; /* Invalid char */

        for (bn_p = bn + bn_words - 1; bn_p >= top_word; --bn_p) {
            uint64_t mult = *bn_p * 58ull + byte;
            *bn_p = mult & 0xffffffff;
            byte = (mult >> 32) & 0xff;
            if (byte && bn_p == top_word) {
                *--top_word = byte; /* Increase bignum size */
                break;
            }
        }
    }

    /* We have our bignum stored from top_word to bn + bn_words - 1. Convert
     * its words to big-endian so we can simply memcpy it to bytes_out. */
    for (bn_p = top_word; bn_p < bn + bn_words; ++bn_p)
        *bn_p = cpu_to_be32(*bn_p); /* No-op on big-endian machines */

    for (cp = (unsigned char *)top_word; !*cp; ++cp)
        ; /* Skip leading zero bytes in our bignum */

    /* Copy the result if it fits, cleanup and return */
    cp_len = (unsigned char *)(bn + bn_words) - cp;

    if (bytes_out && ones + cp_len <= *len) {
        memset(bytes_out, 0, ones);
        memcpy(bytes_out + ones, cp, cp_len);
    }

    *len = ones + cp_len;
    ret = WALLY_OK;

cleanup:
    if (bn) {
        wally_clear(bn, bn_words * sizeof(*bn));
        if (bn != bn_buf)
            wally_free(bn);
    }
    return ret;
}